

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O1

int TPZShapeHDivConstant<pzshape::TPZShapeQuad>::ComputeNConnectShapeF(int connect,int order)

{
  int iVar1;
  
  iVar1 = order + 1;
  if (3 < connect) {
    iVar1 = order * order;
  }
  return iVar1;
}

Assistant:

int TPZShapeHDivConstant<TSHAPE>::ComputeNConnectShapeF(int connect, int order)
{

#ifdef DEBUG
    if (connect < 0 || connect > TSHAPE::NFacets) {
        DebugStop();
    }
#endif
    // int order = data.fHDivConnectOrders[connect];
    MElementType thistype = TSHAPE::Type();

    if(thistype == EOned)
    {   
        order++;
        if(connect < 2) return 0;
        else return order;
        // DebugStop();
    }
    else if(thistype == ETriangle)
    {   
        order++;
        if(connect < TSHAPE::NFacets) return (order);
        else {
            order++;
            return (order-1)*(order-2)/2;
        }
    }
    else if(thistype == EQuadrilateral)
    {
        order++;
        if(connect < TSHAPE::NFacets) return (order);
        else return (order-1)*(order-1);
    }
    else if(thistype == ETetraedro)
    {
        order++;
        if(connect < TSHAPE::NFacets) return 1 + (order-1)*(2*order+4)/4;
        else {
            order++;
            return (order-1)*(order-2)*(2*order+3)/6;
        }
    }
    else if(thistype == EPrisma)
    {
        DebugStop();
        // if(connect == 0 || connect == 4) return (order+1)*(order+2)/2;
        // else if(connect < TSHAPE::NFacets) return (order+1)*(order+1);
        // else return order*order*(3*order+5)/2+7*order-2;
    }
    else if(thistype == ECube)
    {
        if(connect < TSHAPE::NFacets) return 1 + order*(order+2);
        else return order*order*(3+2*order);
    }
    DebugStop();
    unreachable();
 }